

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab3-0.c
# Opt level: O1

int checkerBig(void)

{
  bool bVar1;
  bool bVar2;
  ulong in_RAX;
  FILE *__stream;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  int n;
  undefined8 local_38;
  
  local_38 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    iVar4 = -1;
    pcVar3 = "can\'t open out.txt";
  }
  else {
    bVar2 = true;
    local_38 = local_38 & 0xffffffff00000000;
    iVar4 = 1999999;
    do {
      pcVar3 = ScanInt((FILE *)__stream,(int *)((long)&local_38 + 4));
      bVar1 = true;
      if (pcVar3 == "PASSED") {
        if ((int)(local_38._4_4_ ^ 0x1234567) < 2000000 && -1 < (long)local_38) {
          if (iVar4 == 1999999) {
            bVar1 = false;
            local_38 = CONCAT44(local_38._4_4_,local_38._4_4_);
          }
          else {
            if ((int)local_38._4_4_ <= (int)local_38) goto LAB_00102651;
            bVar1 = false;
          }
        }
        else {
LAB_00102651:
          bVar2 = false;
          printf("wrong output -- ");
        }
      }
      else {
        bVar2 = false;
      }
      bVar5 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while ((!bVar1) && (bVar5));
    if (bVar2) {
      iVar4 = HaveGarbageAtTheEnd((FILE *)__stream);
      fclose(__stream);
      if (iVar4 == 0) {
        iVar4 = 0;
        pcVar3 = "PASSED";
        goto LAB_001026d3;
      }
    }
    else {
      fclose(__stream);
    }
    iVar4 = 1;
    pcVar3 = "FAILED";
  }
LAB_001026d3:
  puts(pcVar3);
  testN = testN + 1;
  return iVar4;
}

Assistant:

static int checkerBig(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i, passed = 1, last = 0;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 2000000; i++) {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
            break;
        } else if ((n^0x1234567) < 0 || 2000000 <= (n^0x1234567)) {
            passed = 0;
            printf("wrong output -- ");
            break;
        } else if (i == 0) {
            last = n;
            continue;
        } else if (n <= last ) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}